

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::DuplicateRowsPS(DuplicateRowsPS *this,DuplicateRowsPS *old)

{
  long in_RSI;
  DataArray<bool> *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffffa8;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffffb0;
  DataArray<bool> *old_00;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffffb0,(PostStep *)in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__DuplicateRowsPS_0089d868;
  *(undefined4 *)&in_RDI[1].memFactor = *(undefined4 *)(in_RSI + 0x28);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[5].themax = *(int *)(in_RSI + 0x7c);
  *(undefined4 *)&in_RDI[5].data = *(undefined4 *)(in_RSI + 0x80);
  *(byte *)((long)&in_RDI[5].data + 4) = *(byte *)(in_RSI + 0x84) & 1;
  *(byte *)((long)&in_RDI[5].data + 5) = *(byte *)(in_RSI + 0x85) & 1;
  *(byte *)((long)&in_RDI[5].data + 6) = *(byte *)(in_RSI + 0x86) & 1;
  *(byte *)((long)&in_RDI[5].data + 7) = *(byte *)(in_RSI + 0x87) & 1;
  *(undefined4 *)&in_RDI[5].memFactor = *(undefined4 *)(in_RSI + 0x88);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffb0,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffa8);
  old_00 = (DataArray<bool> *)&in_RDI[7].data;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffb0,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffa8);
  DataArray<int>::DataArray((DataArray<int> *)in_RDI,(DataArray<int> *)old_00);
  DataArray<int>::DataArray((DataArray<int> *)in_RDI,(DataArray<int> *)old_00);
  DataArray<bool>::DataArray(in_RDI,old_00);
  return;
}

Assistant:

DuplicateRowsPS(const DuplicateRowsPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_i_rowObj(old.m_i_rowObj)
         , m_maxLhsIdx(old.m_maxLhsIdx)
         , m_minRhsIdx(old.m_minRhsIdx)
         , m_maxSense(old.m_maxSense)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_fixed(old.m_fixed)
         , m_nCols(old.m_nCols)
         , m_scale(old.m_scale)
         , m_rowObj(old.m_rowObj)
         , m_rIdxLocalOld(old.m_rIdxLocalOld)
         , m_perm(old.m_perm)
         , m_isLhsEqualRhs(old.m_isLhsEqualRhs)
      {}